

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert.cpp
# Opt level: O1

int embree::main(int argc,char **argv)

{
  ParseStream *this;
  CommandLineStream *this_00;
  Ref<embree::Stream<int>_> local_a0;
  string local_98;
  Ref<embree::ParseStream> local_78;
  string local_70;
  string local_50;
  
  g_device = (RTCDevice)rtcNewDevice(0);
  this = (ParseStream *)operator_new(0x48);
  this_00 = (CommandLineStream *)operator_new(0x80);
  local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"command line","");
  CommandLineStream::CommandLineStream(this_00,argc,argv,&local_98);
  local_a0.ptr = (Stream<int> *)this_00;
  (*(this_00->super_Stream<int>).super_RefCount._vptr_RefCount[2])(this_00);
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"\n\t\r ","");
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"");
  ParseStream::ParseStream(this,&local_a0,&local_50,&local_70,false);
  (*(this->
    super_Stream<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>).
    super_RefCount._vptr_RefCount[2])(this);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  if ((CommandLineStream *)local_a0.ptr != (CommandLineStream *)0x0) {
    (*(((Stream<int> *)&(local_a0.ptr)->super_RefCount)->super_RefCount)._vptr_RefCount[3])();
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p);
  }
  local_78.ptr = this;
  (*(this->
    super_Stream<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>).
    super_RefCount._vptr_RefCount[2])(this);
  FileName::FileName((FileName *)&local_98);
  parseCommandLine(&local_78,(FileName *)&local_98);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p);
  }
  (*(this->
    super_Stream<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>).
    super_RefCount._vptr_RefCount[3])(this);
  rtcReleaseDevice(g_device);
  g_device = (RTCDevice)0x0;
  (*(this->
    super_Stream<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>).
    super_RefCount._vptr_RefCount[3])(this);
  return 0;
}

Assistant:

int main(int argc, char** argv) 
  {
    g_device = rtcNewDevice(nullptr);
      
    /* create stream for parsing */
    Ref<ParseStream> stream = new ParseStream(new CommandLineStream(argc, argv));

    /* parse command line */  
    parseCommandLine(stream, FileName());

    rtcReleaseDevice(g_device); g_device = nullptr;
    return 0;
  }